

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<const_slang::ast::TimingControl_*>::reallocateTo
          (SmallVectorBase<const_slang::ast::TimingControl_*> *this,size_type newCapacity)

{
  TimingControl **__last;
  EVP_PKEY_CTX *ctx;
  TimingControl **in_RSI;
  SmallVectorBase<const_slang::ast::TimingControl_*> *in_RDI;
  pointer newData;
  
  __last = (TimingControl **)operator_new(0x5fc926);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::ast::TimingControl_const**,slang::ast::TimingControl_const**>
            (in_RSI,__last,(TimingControl **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }